

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_stl_str_view_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_stl_str_view_Test<char32_t> *this)

{
  bool bVar1;
  char32_t *pcVar2;
  char *message;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_R9;
  AssertionHelper local_260;
  Fixed local_220;
  char32_t *local_98;
  undefined1 local_90 [8];
  AssertionResult iutest_ar;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_60;
  b_str_view<char_type>_conflict2 local_50;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_40;
  undefined1 local_30 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> re;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_stl_str_view_Test<char32_t> *this_local;
  
  pcVar2 = constant::arikitari_na_world_underscore<char32_t>();
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view
            ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&re._M_str,pcVar2);
  pcVar2 = constant::space_underscore<char32_t>();
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view(&local_60,pcVar2)
  ;
  local_50 = (b_str_view<char_type>_conflict2)
             split<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>(local_60)
  ;
  at_last();
  detail::split_at_last::front((split_at_last *)&iutest_ar.field_0x26);
  local_40 = (basic_string_view<char32_t,_std::char_traits<char32_t>_>)
             detail::
             split_helper<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
             ::operator>><detail::split_at_last_front,_nullptr>
                       ((split_helper<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                         *)&local_50);
  _local_30 = detail::
              operator|<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_char32_t,_nullptr>
                        ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&re._M_str,
                         (split_helper_subroutine<detail::split_at_last_front,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_char32_t>
                          *)&local_40);
  iutest::detail::AlwaysZero();
  local_98 = constant::arikitari_na<char32_t>();
  iutest::internal::EqHelper<false>::
  Compare<char32_t_const*,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            ((AssertionResult *)local_90,(EqHelper<false> *)"constant::arikitari_na<char_type>()",
             "re",(char *)&local_98,(char32_t **)local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    memset(&local_220,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_220);
    message = iutest::AssertionResult::message((AssertionResult *)local_90);
    iutest::AssertionHelper::AssertionHelper
              (&local_260,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0xaa,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_260,&local_220);
    iutest::AssertionHelper::~AssertionHelper(&local_260);
    iutest::AssertionHelper::Fixed::~Fixed(&local_220);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_front_by_stl_str_view)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string_view<char_type>(constant::space_underscore<char_type>())) >> at_last().front();
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re);
}